

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SummaryColumn * __thiscall
Catch::ConsoleReporter::SummaryColumn::addRow
          (SummaryColumn *__return_storage_ptr__,SummaryColumn *this,size_t count)

{
  ulong uVar1;
  pointer __rhs;
  string row;
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  for (__rhs = (this->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      __rhs != (this->rows).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
    while( true ) {
      uVar1 = __rhs->_M_string_length;
      if (local_1e8._M_string_length <= uVar1) break;
      std::operator+(&local_1c8," ",__rhs);
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    while (local_1e8._M_string_length < uVar1) {
      std::operator+(&local_1c8," ",&local_1e8);
      std::__cxx11::string::operator=((string *)&local_1e8,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      uVar1 = __rhs->_M_string_length;
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->rows,&local_1e8);
  SummaryColumn(__return_storage_ptr__,this);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

SummaryColumn addRow( std::size_t count ) {
                std::ostringstream oss;
                oss << count;
                std::string row = oss.str();
                for( std::vector<std::string>::iterator it = rows.begin(); it != rows.end(); ++it ) {
                    while( it->size() < row.size() )
                        *it = " " + *it;
                    while( it->size() > row.size() )
                        row = " " + row;
                }
                rows.push_back( row );
                return *this;
            }